

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VBufSize(N_Vector x,sunindextype *size)

{
  SUNErrCode SVar1;
  undefined8 in_RSI;
  long in_RDI;
  SUNErrCode ier;
  SUNContext sunctx_local_scope_;
  
  SVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x198))(in_RDI,in_RSI);
  return SVar1;
}

Assistant:

SUNErrCode N_VBufSize(N_Vector x, sunindextype* size)
{
  SUNFunctionBegin(x->sunctx);
  SUNErrCode ier = SUN_SUCCESS;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));
  SUNAssert(x->ops->nvbufsize, SUN_ERR_NOT_IMPLEMENTED);
  ier = x->ops->nvbufsize(x, size);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return (ier);
}